

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

int twin_messenger_set_option(TWIN_MESSENGER_HANDLE twin_msgr_handle,char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  LOGGER_LOG l;
  int result;
  void *value_local;
  char *name_local;
  TWIN_MESSENGER_HANDLE twin_msgr_handle_local;
  
  if (((twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0) || (name == (char *)0x0)) ||
     (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_set_option",0x811,1,
                "Invalid argument (twin_msgr_handle=%p, name=%p, value=%p)",twin_msgr_handle,name,
                value);
    }
    l._4_4_ = 0x812;
  }
  else {
    iVar1 = amqp_messenger_set_option(twin_msgr_handle->amqp_msgr,name,value);
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"twin_messenger_set_option",0x81a,1,
                  "Failed setting TWIN messenger option (%s, %s)",twin_msgr_handle->device_id,name);
      }
      l._4_4_ = 0x81b;
    }
  }
  return l._4_4_;
}

Assistant:

int twin_messenger_set_option(TWIN_MESSENGER_HANDLE twin_msgr_handle, const char* name, void* value)
{
    int result;

    if (twin_msgr_handle == NULL || name == NULL || value == NULL)
    {
        LogError("Invalid argument (twin_msgr_handle=%p, name=%p, value=%p)", twin_msgr_handle, name, value);
        result = MU_FAILURE;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;

        if (amqp_messenger_set_option(twin_msgr->amqp_msgr, name, value) != RESULT_OK)
        {
            LogError("Failed setting TWIN messenger option (%s, %s)", twin_msgr->device_id, name);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }

    return result;
}